

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

void __thiscall
chrono::ChArchiveExplorer::out_ref
          (ChArchiveExplorer *this,ChValue *bVal,bool already_inserted,size_t obj_ID,size_t ext_ID)

{
  pointer pbVar1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference rVar6;
  string username;
  
  if ((this->found != true) || (this->find_all == true)) {
    pbVar1 = (this->search_tokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)this->tablevel <
        (ulong)((long)(this->search_tokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
      bVar4 = MatchName(this,pbVar1 + this->tablevel,(bVal->_name)._M_dataplus._M_p);
      iVar5 = this->tablevel;
      if (iVar5 != 0 && !bVar4) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->in_array,(long)iVar5);
        if ((*rVar6._M_p & rVar6._M_mask) == 0) {
          return;
        }
        if (this->use_user_names != true) {
          return;
        }
        pbVar1 = (this->search_tokens).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar2 = pbVar1[this->tablevel]._M_string_length;
        if (sVar2 == 0) {
          return;
        }
        pcVar3 = pbVar1[this->tablevel]._M_dataplus._M_p;
        if (*pcVar3 != '\'') {
          return;
        }
        if (pcVar3[sVar2 - 1] != '\'') {
          return;
        }
        iVar5 = (*bVal->_vptr_ChValue[0xf])(bVal);
        if ((char)iVar5 == '\0') {
          return;
        }
        std::__cxx11::string::substr
                  ((ulong)&username,
                   (ulong)((this->search_tokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->tablevel));
        iVar5 = (*bVal->_vptr_ChValue[0x10])(bVal);
        bVar4 = MatchName(this,&username,*(char **)CONCAT44(extraout_var_00,iVar5));
        std::__cxx11::string::~string((string *)&username);
        if (!bVar4) {
          return;
        }
        iVar5 = this->tablevel;
      }
      this->found_obj = true;
      if ((long)(this->search_tokens).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->search_tokens).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 == (long)(iVar5 + 1)) {
        iVar5 = (*bVal->_vptr_ChValue[2])(bVal);
        username._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar5);
        std::vector<chrono::ChValue*,std::allocator<chrono::ChValue*>>::
        emplace_back<chrono::ChValue*>
                  ((vector<chrono::ChValue*,std::allocator<chrono::ChValue*>> *)&this->results,
                   (ChValue **)&username);
        this->found = true;
      }
      else {
        this->tablevel = iVar5 + 1;
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,false);
        (*bVal->_vptr_ChValue[0xd])(bVal,this);
        this->tablevel = this->tablevel + -1;
        std::_Bit_iterator_base::_M_bump_down
                  (&(this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base);
      }
    }
  }
  return;
}

Assistant:

virtual void out_ref          (ChValue& bVal,  bool already_inserted, size_t obj_ID, size_t ext_ID) 
      {
          if (this->found && !this->find_all) return;
          if (this->tablevel >= this->search_tokens.size()) return;

          bool matched = this->MatchName(search_tokens[this->tablevel],bVal.name()) || (tablevel==0);
          if (      ! matched 
                    && tablevel
                    && this->in_array[tablevel] 
                    && this->use_user_names 
                    && !search_tokens[this->tablevel].empty()
                    && (search_tokens[this->tablevel].front()==*"'" && search_tokens[this->tablevel].back()==*"'")
                    && bVal.HasArchiveContainerName() ) {
              std::string username = search_tokens[this->tablevel].substr(1,search_tokens[this->tablevel].length()-2);
              matched = this->MatchName(username,bVal.CallArchiveContainerName().c_str());
          }

          if (matched) {
                this->found_obj = true;
                if (this->tablevel +1 == this->search_tokens.size()) {
                    this->results.push_back(bVal.new_clone());
                    this->found = true;
                } else {
                    ++tablevel;
                    in_array.push_back(false);
                    bVal.CallArchiveOut(*this);
                    --tablevel;
                    in_array.pop_back();
                }
          }
      }